

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

int __thiscall gl4cts::EnhancedLayoutsTests::init(EnhancedLayoutsTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  GLSLContantImmutablityTest *this_00;
  GLSLConstantIntegralExpressionTest *this_01;
  UniformBlockLayoutQualifierConflictTest *this_02;
  VaryingExceedingComponentsTest *this_03;
  VaryingComponentOfInvalidTypeTest *this_04;
  OutputComponentAliasingTest *this_05;
  VertexAttribLocationAPITest *this_06;
  XFBInputTest *this_07;
  XFBStrideTest *this_08;
  UniformBlockMemberOffsetAndAlignTest *this_09;
  UniformBlockMemberInvalidOffsetAlignmentTest *this_10;
  UniformBlockMemberOverlappingOffsetsTest *this_11;
  UniformBlockMemberAlignNonPowerOf2Test *this_12;
  SSBLayoutQualifierConflictTest *this_13;
  SSBAlignmentTest *this_14;
  VaryingStructureMemberLocationTest *this_15;
  VaryingBlockAutomaticMemberLocationsTest *this_16;
  VaryingComponentWithoutLocationTest *this_17;
  InputComponentAliasingTest *this_18;
  VaryingLocationAliasingWithMixedTypesTest *this_19;
  VaryingLocationAliasingWithMixedInterpolationTest *this_20;
  VaryingLocationAliasingWithMixedAuxiliaryStorageTest *this_21;
  XFBTooSmallStrideTest *this_22;
  XFBDuplicatedStrideTest *this_23;
  XFBGetProgramResourceAPITest *this_24;
  XFBExceedBufferLimitTest *this_25;
  XFBExceedOffsetLimitTest *this_26;
  XFBBlockMemberBufferTest *this_27;
  XFBOutputOverlappingTest *this_28;
  XFBInvalidOffsetAlignmentTest *this_29;
  XFBCaptureUnsizedArrayTest *this_30;
  UniformBlockAlignmentTest *this_31;
  SSBMemberOffsetAndAlignTest *this_32;
  VaryingLocationsTest *this_33;
  VaryingStructureLocationsTest *this_34;
  VaryingBlockLocationsTest *this_35;
  VaryingBlockMemberLocationsTest *this_36;
  XFBVariableStrideTest *this_37;
  XFBBlockStrideTest *this_38;
  XFBGlobalBufferTest *this_39;
  FragmentDataLocationAPITest *this_40;
  VaryingLocationLimitTest *this_41;
  VaryingComponentsTest *this_42;
  EnhancedLayoutsTests *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x78);
  EnhancedLayouts::APIConstantValuesTest::APIConstantValuesTest
            ((APIConstantValuesTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  EnhancedLayouts::APIErrorsTest::APIErrorsTest
            ((APIErrorsTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  EnhancedLayouts::GLSLContantValuesTest::GLSLContantValuesTest
            ((GLSLContantValuesTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_00 = (GLSLContantImmutablityTest *)operator_new(0x90);
  EnhancedLayouts::GLSLContantImmutablityTest::GLSLContantImmutablityTest
            (this_00,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (GLSLConstantIntegralExpressionTest *)operator_new(0x80);
  EnhancedLayouts::GLSLConstantIntegralExpressionTest::GLSLConstantIntegralExpressionTest
            (this_01,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  this_02 = (UniformBlockLayoutQualifierConflictTest *)operator_new(0x90);
  EnhancedLayouts::UniformBlockLayoutQualifierConflictTest::UniformBlockLayoutQualifierConflictTest
            (this_02,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  pTVar1 = (TestNode *)operator_new(0x90);
  EnhancedLayouts::SSBMemberInvalidOffsetAlignmentTest::SSBMemberInvalidOffsetAlignmentTest
            ((SSBMemberInvalidOffsetAlignmentTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x90);
  EnhancedLayouts::SSBMemberOverlappingOffsetsTest::SSBMemberOverlappingOffsetsTest
            ((SSBMemberOverlappingOffsetsTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_03 = (VaryingExceedingComponentsTest *)operator_new(0x90);
  EnhancedLayouts::VaryingExceedingComponentsTest::VaryingExceedingComponentsTest
            (this_03,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
  this_04 = (VaryingComponentOfInvalidTypeTest *)operator_new(0x90);
  EnhancedLayouts::VaryingComponentOfInvalidTypeTest::VaryingComponentOfInvalidTypeTest
            (this_04,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_04);
  this_05 = (OutputComponentAliasingTest *)operator_new(0x90);
  EnhancedLayouts::OutputComponentAliasingTest::OutputComponentAliasingTest
            (this_05,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_05);
  this_06 = (VertexAttribLocationAPITest *)operator_new(0xd8);
  EnhancedLayouts::VertexAttribLocationAPITest::VertexAttribLocationAPITest
            (this_06,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_06);
  this_07 = (XFBInputTest *)operator_new(0x90);
  EnhancedLayouts::XFBInputTest::XFBInputTest(this_07,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_07);
  pTVar1 = (TestNode *)operator_new(0x78);
  EnhancedLayouts::XFBAllStagesTest::XFBAllStagesTest
            ((XFBAllStagesTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  EnhancedLayouts::XFBCaptureInactiveOutputVariableTest::XFBCaptureInactiveOutputVariableTest
            ((XFBCaptureInactiveOutputVariableTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  EnhancedLayouts::XFBCaptureInactiveOutputComponentTest::XFBCaptureInactiveOutputComponentTest
            ((XFBCaptureInactiveOutputComponentTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  EnhancedLayouts::XFBCaptureInactiveOutputBlockMemberTest::XFBCaptureInactiveOutputBlockMemberTest
            ((XFBCaptureInactiveOutputBlockMemberTest *)pTVar1,(this->super_TestCaseGroup).m_context
            );
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_08 = (XFBStrideTest *)operator_new(0x90);
  EnhancedLayouts::XFBStrideTest::XFBStrideTest(this_08,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_08);
  this_09 = (UniformBlockMemberOffsetAndAlignTest *)operator_new(0x90);
  EnhancedLayouts::UniformBlockMemberOffsetAndAlignTest::UniformBlockMemberOffsetAndAlignTest
            (this_09,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_09);
  this_10 = (UniformBlockMemberInvalidOffsetAlignmentTest *)operator_new(0x90);
  EnhancedLayouts::UniformBlockMemberInvalidOffsetAlignmentTest::
  UniformBlockMemberInvalidOffsetAlignmentTest(this_10,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_10);
  this_11 = (UniformBlockMemberOverlappingOffsetsTest *)operator_new(0x90);
  EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::
  UniformBlockMemberOverlappingOffsetsTest(this_11,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_11);
  this_12 = (UniformBlockMemberAlignNonPowerOf2Test *)operator_new(0x90);
  EnhancedLayouts::UniformBlockMemberAlignNonPowerOf2Test::UniformBlockMemberAlignNonPowerOf2Test
            (this_12,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_12);
  this_13 = (SSBLayoutQualifierConflictTest *)operator_new(0x90);
  EnhancedLayouts::SSBLayoutQualifierConflictTest::SSBLayoutQualifierConflictTest
            (this_13,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_13);
  pTVar1 = (TestNode *)operator_new(0x90);
  EnhancedLayouts::SSBMemberAlignNonPowerOf2Test::SSBMemberAlignNonPowerOf2Test
            ((SSBMemberAlignNonPowerOf2Test *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_14 = (SSBAlignmentTest *)operator_new(0x90);
  EnhancedLayouts::SSBAlignmentTest::SSBAlignmentTest(this_14,(this->super_TestCaseGroup).m_context)
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_14);
  this_15 = (VaryingStructureMemberLocationTest *)operator_new(0x90);
  EnhancedLayouts::VaryingStructureMemberLocationTest::VaryingStructureMemberLocationTest
            (this_15,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_15);
  this_16 = (VaryingBlockAutomaticMemberLocationsTest *)operator_new(0x90);
  EnhancedLayouts::VaryingBlockAutomaticMemberLocationsTest::
  VaryingBlockAutomaticMemberLocationsTest(this_16,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_16);
  this_17 = (VaryingComponentWithoutLocationTest *)operator_new(0x90);
  EnhancedLayouts::VaryingComponentWithoutLocationTest::VaryingComponentWithoutLocationTest
            (this_17,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_17);
  this_18 = (InputComponentAliasingTest *)operator_new(0x90);
  EnhancedLayouts::InputComponentAliasingTest::InputComponentAliasingTest
            (this_18,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_18);
  this_19 = (VaryingLocationAliasingWithMixedTypesTest *)operator_new(0x90);
  EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::
  VaryingLocationAliasingWithMixedTypesTest(this_19,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_19);
  this_20 = (VaryingLocationAliasingWithMixedInterpolationTest *)operator_new(0x90);
  EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::
  VaryingLocationAliasingWithMixedInterpolationTest(this_20,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_20);
  this_21 = (VaryingLocationAliasingWithMixedAuxiliaryStorageTest *)operator_new(0x90);
  EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::
  VaryingLocationAliasingWithMixedAuxiliaryStorageTest
            (this_21,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_21);
  pTVar1 = (TestNode *)operator_new(0x78);
  EnhancedLayouts::XFBStrideOfEmptyListTest::XFBStrideOfEmptyListTest
            ((XFBStrideOfEmptyListTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  EnhancedLayouts::XFBStrideOfEmptyListAndAPITest::XFBStrideOfEmptyListAndAPITest
            ((XFBStrideOfEmptyListAndAPITest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_22 = (XFBTooSmallStrideTest *)operator_new(0x90);
  EnhancedLayouts::XFBTooSmallStrideTest::XFBTooSmallStrideTest
            (this_22,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_22);
  pTVar1 = (TestNode *)operator_new(0x78);
  EnhancedLayouts::XFBBlockMemberStrideTest::XFBBlockMemberStrideTest
            ((XFBBlockMemberStrideTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_23 = (XFBDuplicatedStrideTest *)operator_new(0x90);
  EnhancedLayouts::XFBDuplicatedStrideTest::XFBDuplicatedStrideTest
            (this_23,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_23);
  this_24 = (XFBGetProgramResourceAPITest *)operator_new(0x90);
  EnhancedLayouts::XFBGetProgramResourceAPITest::XFBGetProgramResourceAPITest
            (this_24,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_24);
  pTVar1 = (TestNode *)operator_new(0x78);
  EnhancedLayouts::XFBMultipleVertexStreamsTest::XFBMultipleVertexStreamsTest
            ((XFBMultipleVertexStreamsTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_25 = (XFBExceedBufferLimitTest *)operator_new(0x90);
  EnhancedLayouts::XFBExceedBufferLimitTest::XFBExceedBufferLimitTest
            (this_25,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_25);
  this_26 = (XFBExceedOffsetLimitTest *)operator_new(0x90);
  EnhancedLayouts::XFBExceedOffsetLimitTest::XFBExceedOffsetLimitTest
            (this_26,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_26);
  this_27 = (XFBBlockMemberBufferTest *)operator_new(0x90);
  EnhancedLayouts::XFBBlockMemberBufferTest::XFBBlockMemberBufferTest
            (this_27,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_27);
  this_28 = (XFBOutputOverlappingTest *)operator_new(0x90);
  EnhancedLayouts::XFBOutputOverlappingTest::XFBOutputOverlappingTest
            (this_28,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_28);
  this_29 = (XFBInvalidOffsetAlignmentTest *)operator_new(0x90);
  EnhancedLayouts::XFBInvalidOffsetAlignmentTest::XFBInvalidOffsetAlignmentTest
            (this_29,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_29);
  pTVar1 = (TestNode *)operator_new(0x78);
  EnhancedLayouts::XFBCaptureStructTest::XFBCaptureStructTest
            ((XFBCaptureStructTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_30 = (XFBCaptureUnsizedArrayTest *)operator_new(0x90);
  EnhancedLayouts::XFBCaptureUnsizedArrayTest::XFBCaptureUnsizedArrayTest
            (this_30,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_30);
  this_31 = (UniformBlockAlignmentTest *)operator_new(0x90);
  EnhancedLayouts::UniformBlockAlignmentTest::UniformBlockAlignmentTest
            (this_31,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_31);
  this_32 = (SSBMemberOffsetAndAlignTest *)operator_new(0x90);
  EnhancedLayouts::SSBMemberOffsetAndAlignTest::SSBMemberOffsetAndAlignTest
            (this_32,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_32);
  pTVar1 = (TestNode *)operator_new(0x78);
  EnhancedLayouts::VertexAttribLocationsTest::VertexAttribLocationsTest
            ((VertexAttribLocationsTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_33 = (VaryingLocationsTest *)operator_new(0xa8);
  EnhancedLayouts::VaryingLocationsTest::VaryingLocationsTest
            (this_33,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_33);
  pTVar1 = (TestNode *)operator_new(0xa8);
  EnhancedLayouts::VaryingArrayLocationsTest::VaryingArrayLocationsTest
            ((VaryingArrayLocationsTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_34 = (VaryingStructureLocationsTest *)operator_new(0xc0);
  EnhancedLayouts::VaryingStructureLocationsTest::VaryingStructureLocationsTest
            (this_34,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_34);
  this_35 = (VaryingBlockLocationsTest *)operator_new(0xd8);
  EnhancedLayouts::VaryingBlockLocationsTest::VaryingBlockLocationsTest
            (this_35,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_35);
  this_36 = (VaryingBlockMemberLocationsTest *)operator_new(0x90);
  EnhancedLayouts::VaryingBlockMemberLocationsTest::VaryingBlockMemberLocationsTest
            (this_36,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_36);
  this_37 = (XFBVariableStrideTest *)operator_new(0x90);
  EnhancedLayouts::XFBVariableStrideTest::XFBVariableStrideTest
            (this_37,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_37);
  this_38 = (XFBBlockStrideTest *)operator_new(0x90);
  EnhancedLayouts::XFBBlockStrideTest::XFBBlockStrideTest
            (this_38,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_38);
  pTVar1 = (TestNode *)operator_new(0x78);
  EnhancedLayouts::XFBOverrideQualifiersWithAPITest::XFBOverrideQualifiersWithAPITest
            ((XFBOverrideQualifiersWithAPITest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  EnhancedLayouts::XFBVertexStreamsTest::XFBVertexStreamsTest
            ((XFBVertexStreamsTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_39 = (XFBGlobalBufferTest *)operator_new(0x90);
  EnhancedLayouts::XFBGlobalBufferTest::XFBGlobalBufferTest
            (this_39,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_39);
  this_40 = (FragmentDataLocationAPITest *)operator_new(0xe8);
  EnhancedLayouts::FragmentDataLocationAPITest::FragmentDataLocationAPITest
            (this_40,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_40);
  this_41 = (VaryingLocationLimitTest *)operator_new(0x90);
  EnhancedLayouts::VaryingLocationLimitTest::VaryingLocationLimitTest
            (this_41,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_41);
  this_42 = (VaryingComponentsTest *)operator_new(0xd8);
  EnhancedLayouts::VaryingComponentsTest::VaryingComponentsTest
            (this_42,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_42);
  pTVar1 = (TestNode *)operator_new(0xd8);
  EnhancedLayouts::VaryingArrayComponentsTest::VaryingArrayComponentsTest
            ((VaryingArrayComponentsTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void EnhancedLayoutsTests::init(void)
{
	addChild(new EnhancedLayouts::APIConstantValuesTest(m_context));
	addChild(new EnhancedLayouts::APIErrorsTest(m_context));
	addChild(new EnhancedLayouts::GLSLContantValuesTest(m_context));
	addChild(new EnhancedLayouts::GLSLContantImmutablityTest(m_context));
	addChild(new EnhancedLayouts::GLSLConstantIntegralExpressionTest(m_context));
	addChild(new EnhancedLayouts::UniformBlockLayoutQualifierConflictTest(m_context));
	addChild(new EnhancedLayouts::SSBMemberInvalidOffsetAlignmentTest(m_context));
	addChild(new EnhancedLayouts::SSBMemberOverlappingOffsetsTest(m_context));
	addChild(new EnhancedLayouts::VaryingExceedingComponentsTest(m_context));
	addChild(new EnhancedLayouts::VaryingComponentOfInvalidTypeTest(m_context));
	addChild(new EnhancedLayouts::OutputComponentAliasingTest(m_context));
	addChild(new EnhancedLayouts::VertexAttribLocationAPITest(m_context));
	addChild(new EnhancedLayouts::XFBInputTest(m_context));
	addChild(new EnhancedLayouts::XFBAllStagesTest(m_context));
	addChild(new EnhancedLayouts::XFBCaptureInactiveOutputVariableTest(m_context));
	addChild(new EnhancedLayouts::XFBCaptureInactiveOutputComponentTest(m_context));
	addChild(new EnhancedLayouts::XFBCaptureInactiveOutputBlockMemberTest(m_context));
	addChild(new EnhancedLayouts::XFBStrideTest(m_context));

	addChild(new EnhancedLayouts::UniformBlockMemberOffsetAndAlignTest(m_context));
	addChild(new EnhancedLayouts::UniformBlockMemberInvalidOffsetAlignmentTest(m_context));
	addChild(new EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest(m_context));
	addChild(new EnhancedLayouts::UniformBlockMemberAlignNonPowerOf2Test(m_context));
	addChild(new EnhancedLayouts::SSBLayoutQualifierConflictTest(m_context));
	addChild(new EnhancedLayouts::SSBMemberAlignNonPowerOf2Test(m_context));
	addChild(new EnhancedLayouts::SSBAlignmentTest(m_context));
	addChild(new EnhancedLayouts::VaryingStructureMemberLocationTest(m_context));
	addChild(new EnhancedLayouts::VaryingBlockAutomaticMemberLocationsTest(m_context));
	addChild(new EnhancedLayouts::VaryingComponentWithoutLocationTest(m_context));
	addChild(new EnhancedLayouts::InputComponentAliasingTest(m_context));
	addChild(new EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest(m_context));
	addChild(new EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest(m_context));
	addChild(new EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest(m_context));
	addChild(new EnhancedLayouts::XFBStrideOfEmptyListTest(m_context));
	addChild(new EnhancedLayouts::XFBStrideOfEmptyListAndAPITest(m_context));
	addChild(new EnhancedLayouts::XFBTooSmallStrideTest(m_context));
	addChild(new EnhancedLayouts::XFBBlockMemberStrideTest(m_context));
	addChild(new EnhancedLayouts::XFBDuplicatedStrideTest(m_context));
	addChild(new EnhancedLayouts::XFBGetProgramResourceAPITest(m_context));
	addChild(new EnhancedLayouts::XFBMultipleVertexStreamsTest(m_context));
	addChild(new EnhancedLayouts::XFBExceedBufferLimitTest(m_context));
	addChild(new EnhancedLayouts::XFBExceedOffsetLimitTest(m_context));
	addChild(new EnhancedLayouts::XFBBlockMemberBufferTest(m_context));
	addChild(new EnhancedLayouts::XFBOutputOverlappingTest(m_context));
	addChild(new EnhancedLayouts::XFBInvalidOffsetAlignmentTest(m_context));
	addChild(new EnhancedLayouts::XFBCaptureStructTest(m_context));
	addChild(new EnhancedLayouts::XFBCaptureUnsizedArrayTest(m_context));
	addChild(new EnhancedLayouts::UniformBlockAlignmentTest(m_context));
	addChild(new EnhancedLayouts::SSBMemberOffsetAndAlignTest(m_context));
	addChild(new EnhancedLayouts::VertexAttribLocationsTest(m_context));
	addChild(new EnhancedLayouts::VaryingLocationsTest(m_context));
	addChild(new EnhancedLayouts::VaryingArrayLocationsTest(m_context));
	addChild(new EnhancedLayouts::VaryingStructureLocationsTest(m_context));
	addChild(new EnhancedLayouts::VaryingBlockLocationsTest(m_context));
	addChild(new EnhancedLayouts::VaryingBlockMemberLocationsTest(m_context));
	addChild(new EnhancedLayouts::XFBVariableStrideTest(m_context));
	addChild(new EnhancedLayouts::XFBBlockStrideTest(m_context));
	addChild(new EnhancedLayouts::XFBOverrideQualifiersWithAPITest(m_context));
	addChild(new EnhancedLayouts::XFBVertexStreamsTest(m_context));
	addChild(new EnhancedLayouts::XFBGlobalBufferTest(m_context));
	addChild(new EnhancedLayouts::FragmentDataLocationAPITest(m_context));
	addChild(new EnhancedLayouts::VaryingLocationLimitTest(m_context));
	addChild(new EnhancedLayouts::VaryingComponentsTest(m_context));
	addChild(new EnhancedLayouts::VaryingArrayComponentsTest(m_context));
}